

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressed_materialization.cpp
# Opt level: O1

void __thiscall
duckdb::CompressedMaterialization::CreateDecompressProjection
          (CompressedMaterialization *this,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *op,CompressedMaterializationInfo *info)

{
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  *this_00;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var1;
  undefined8 uVar2;
  BaseStatistics *pBVar3;
  undefined1 auVar4 [8];
  pointer pLVar5;
  const_reference pvVar6;
  const_reference args;
  idx_t table_index;
  _Tuple_impl<0UL,_duckdb::LogicalProjection_*,_std::default_delete<duckdb::LogicalProjection>_>
  this_01;
  pointer pLVar7;
  reference this_02;
  type pLVar8;
  reference __args_1;
  reference __args_2;
  reference pvVar9;
  __uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_> *this_03;
  size_type sVar10;
  _Hash_node_base *p_Var11;
  templated_unique_single_t decompress_projection;
  vector<duckdb::ColumnBinding,_true> bindings;
  ColumnBindingReplacer replacer;
  vector<duckdb::optional_ptr<duckdb::BaseStatistics,_true>,_true> statistics;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  decompress_exprs;
  vector<duckdb::ColumnBinding,_true> new_bindings;
  undefined1 local_100 [16];
  optional_ptr<duckdb::LogicalOperator,_true> local_f0;
  BaseStatistics *local_e8;
  vector<duckdb::ColumnBinding,_true> local_e0;
  undefined1 local_c8 [8];
  anon_union_40_2_2e033cff_for_stats_union aStack_c0;
  vector<duckdb::optional_ptr<duckdb::BaseStatistics,_true>,_true> local_98;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  local_78;
  pointer local_58;
  vector<duckdb::ColumnBinding,_true> local_50;
  CompressedMaterializationInfo *local_38;
  
  local_f0.ptr = (LogicalOperator *)this;
  local_38 = info;
  pLVar5 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(op);
  (*pLVar5->_vptr_LogicalOperator[2])(&local_e0,pLVar5);
  pLVar5 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(op);
  LogicalOperator::ResolveOperatorTypes(pLVar5);
  local_58 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->(op);
  local_78.
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.
  super_vector<duckdb::optional_ptr<duckdb::BaseStatistics,_true>,_std::allocator<duckdb::optional_ptr<duckdb::BaseStatistics,_true>_>_>
  .
  super__Vector_base<duckdb::optional_ptr<duckdb::BaseStatistics,_true>,_std::allocator<duckdb::optional_ptr<duckdb::BaseStatistics,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (optional_ptr<duckdb::BaseStatistics,_true> *)0x0;
  local_98.
  super_vector<duckdb::optional_ptr<duckdb::BaseStatistics,_true>,_std::allocator<duckdb::optional_ptr<duckdb::BaseStatistics,_true>_>_>
  .
  super__Vector_base<duckdb::optional_ptr<duckdb::BaseStatistics,_true>,_std::allocator<duckdb::optional_ptr<duckdb::BaseStatistics,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super_vector<duckdb::optional_ptr<duckdb::BaseStatistics,_true>,_std::allocator<duckdb::optional_ptr<duckdb::BaseStatistics,_true>_>_>
  .
  super__Vector_base<duckdb::optional_ptr<duckdb::BaseStatistics,_true>,_std::allocator<duckdb::optional_ptr<duckdb::BaseStatistics,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (optional_ptr<duckdb::BaseStatistics,_true> *)0x0;
  if (local_e0.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
      super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_e0.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
      super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_58 = (pointer)&local_58->types;
    sVar10 = 0;
    do {
      pvVar6 = vector<duckdb::ColumnBinding,_true>::operator[](&local_e0,sVar10);
      args = vector<duckdb::LogicalType,_true>::operator[]
                       ((vector<duckdb::LogicalType,_true> *)local_58,sVar10);
      make_uniq_base<duckdb::Expression,duckdb::BoundColumnRefExpression,duckdb::LogicalType_const&,duckdb::ColumnBinding_const&>
                ((duckdb *)local_c8,args,pvVar6);
      local_50.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
      super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      for (p_Var11 = (local_38->binding_map)._M_h._M_before_begin._M_nxt;
          p_Var11 != (_Hash_node_base *)0x0; p_Var11 = p_Var11->_M_nxt) {
        if (((p_Var11[3]._M_nxt == (_Hash_node_base *)pvVar6->table_index) &&
            (p_Var11[4]._M_nxt == (_Hash_node_base *)pvVar6->column_index)) &&
           (local_50.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
            super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)p_Var11[9]._M_nxt,
           *(char *)&p_Var11[8]._M_nxt == '\x01')) {
          local_100._8_8_ = local_c8;
          local_c8 = (undefined1  [8])0x0;
          optional_ptr<duckdb::BaseStatistics,_true>::CheckValid
                    ((optional_ptr<duckdb::BaseStatistics,_true> *)&local_50);
          GetDecompressExpression
                    ((CompressedMaterialization *)local_100,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)local_f0.ptr,(LogicalType *)(local_100 + 8),(BaseStatistics *)(p_Var11 + 5))
          ;
          auVar4 = local_c8;
          local_c8 = (undefined1  [8])local_100._0_8_;
          local_100._0_8_ =
               (tuple<duckdb::LogicalProjection_*,_std::default_delete<duckdb::LogicalProjection>_>)
               0x0;
          if (auVar4 != (undefined1  [8])0x0) {
            (**(code **)((long)*(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                 *)auVar4 + 8))();
          }
          local_100._0_8_ = (LogicalProjection *)0x0;
          if ((ClientContext *)local_100._8_8_ != (ClientContext *)0x0) {
            (*(code *)(((((enable_shared_from_this<duckdb::ClientContext> *)local_100._8_8_)->
                        __weak_this_).internal.
                        super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
                      super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)();
          }
          local_100._8_8_ = (ClientContext *)0x0;
        }
      }
      if (local_98.
          super_vector<duckdb::optional_ptr<duckdb::BaseStatistics,_true>,_std::allocator<duckdb::optional_ptr<duckdb::BaseStatistics,_true>_>_>
          .
          super__Vector_base<duckdb::optional_ptr<duckdb::BaseStatistics,_true>,_std::allocator<duckdb::optional_ptr<duckdb::BaseStatistics,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_98.
          super_vector<duckdb::optional_ptr<duckdb::BaseStatistics,_true>,_std::allocator<duckdb::optional_ptr<duckdb::BaseStatistics,_true>_>_>
          .
          super__Vector_base<duckdb::optional_ptr<duckdb::BaseStatistics,_true>,_std::allocator<duckdb::optional_ptr<duckdb::BaseStatistics,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::
        vector<duckdb::optional_ptr<duckdb::BaseStatistics,true>,std::allocator<duckdb::optional_ptr<duckdb::BaseStatistics,true>>>
        ::_M_realloc_insert<duckdb::optional_ptr<duckdb::BaseStatistics,true>const&>
                  ((vector<duckdb::optional_ptr<duckdb::BaseStatistics,true>,std::allocator<duckdb::optional_ptr<duckdb::BaseStatistics,true>>>
                    *)&local_98,
                   (iterator)
                   local_98.
                   super_vector<duckdb::optional_ptr<duckdb::BaseStatistics,_true>,_std::allocator<duckdb::optional_ptr<duckdb::BaseStatistics,_true>_>_>
                   .
                   super__Vector_base<duckdb::optional_ptr<duckdb::BaseStatistics,_true>,_std::allocator<duckdb::optional_ptr<duckdb::BaseStatistics,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   (optional_ptr<duckdb::BaseStatistics,_true> *)&local_50);
      }
      else {
        (local_98.
         super_vector<duckdb::optional_ptr<duckdb::BaseStatistics,_true>,_std::allocator<duckdb::optional_ptr<duckdb::BaseStatistics,_true>_>_>
         .
         super__Vector_base<duckdb::optional_ptr<duckdb::BaseStatistics,_true>,_std::allocator<duckdb::optional_ptr<duckdb::BaseStatistics,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_finish)->ptr =
             (BaseStatistics *)
             local_50.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
             super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
             _M_impl.super__Vector_impl_data._M_start;
        local_98.
        super_vector<duckdb::optional_ptr<duckdb::BaseStatistics,_true>,_std::allocator<duckdb::optional_ptr<duckdb::BaseStatistics,_true>_>_>
        .
        super__Vector_base<duckdb::optional_ptr<duckdb::BaseStatistics,_true>,_std::allocator<duckdb::optional_ptr<duckdb::BaseStatistics,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_98.
             super_vector<duckdb::optional_ptr<duckdb::BaseStatistics,_true>,_std::allocator<duckdb::optional_ptr<duckdb::BaseStatistics,_true>_>_>
             .
             super__Vector_base<duckdb::optional_ptr<duckdb::BaseStatistics,_true>,_std::allocator<duckdb::optional_ptr<duckdb::BaseStatistics,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&local_78,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 local_c8);
      if (local_c8 != (undefined1  [8])0x0) {
        (**(code **)(*(_func_int **)local_c8 + 8))();
      }
      sVar10 = sVar10 + 1;
    } while (sVar10 < (ulong)((long)local_e0.
                                    super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                                    .
                                    super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_e0.
                                    super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                                    .
                                    super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  table_index = Binder::GenerateTableIndex
                          (((Optimizer *)(local_f0.ptr)->_vptr_LogicalOperator)->binder);
  this_01.super__Head_base<0UL,_duckdb::LogicalProjection_*,_false>._M_head_impl =
       (_Head_base<0UL,_duckdb::LogicalProjection_*,_false>)operator_new(0x70);
  local_c8 = (undefined1  [8])
             local_78.
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  aStack_c0.string_data.min =
       (data_t  [8])
       local_78.
       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  aStack_c0.string_data.max =
       (data_t  [8])
       local_78.
       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_78.
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  LogicalProjection::LogicalProjection
            ((LogicalProjection *)
             this_01.super__Head_base<0UL,_duckdb::LogicalProjection_*,_false>._M_head_impl,
             table_index,
             (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              *)local_c8);
  local_100._0_8_ = this_01.super__Head_base<0UL,_duckdb::LogicalProjection_*,_false>._M_head_impl;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             *)local_c8);
  pLVar5 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(op);
  if (pLVar5->has_estimated_cardinality == true) {
    pLVar7 = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
             ::operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                           *)local_100);
    pLVar5 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->(op);
    LogicalOperator::SetEstimatedCardinality
              (&pLVar7->super_LogicalOperator,pLVar5->estimated_cardinality);
  }
  pLVar7 = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
           ::operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                         *)local_100);
  ::std::
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
            ((vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
              *)&(pLVar7->super_LogicalOperator).children,op);
  uVar2 = local_100._0_8_;
  local_100._0_8_ =
       (_Tuple_impl<0UL,_duckdb::LogicalProjection_*,_std::default_delete<duckdb::LogicalProjection>_>
        )0x0;
  _Var1._M_head_impl =
       (op->super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       )._M_t.
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  (op->super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
  _M_t.super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)uVar2;
  if (_Var1._M_head_impl != (LogicalOperator *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_LogicalOperator + 8))();
  }
  pLVar5 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(op);
  this_02 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
            ::operator[](&pLVar5->children,0);
  pLVar8 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator*(this_02);
  this_00 = &(local_f0.ptr)->children;
  optional_ptr<duckdb::LogicalOperator,_true>::CheckValid
            ((optional_ptr<duckdb::LogicalOperator,_true> *)this_00);
  if (pLVar8 == (type)(this_00->
                      super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                      ).
                      super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) {
    (this_00->
    super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
    ).
    super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)(op->
                  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  )._M_t.
                  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                  .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  }
  else {
    pLVar5 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->(op);
    (*pLVar5->_vptr_LogicalOperator[2])(&local_50,pLVar5);
    pLVar5 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->(op);
    LogicalOperator::ResolveOperatorTypes(pLVar5);
    pLVar5 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->(op);
    ColumnBindingReplacer::ColumnBindingReplacer((ColumnBindingReplacer *)local_c8);
    if (local_e0.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
        super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_e0.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
        super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
        super__Vector_impl_data._M_start) {
      sVar10 = 0;
      do {
        pvVar6 = vector<duckdb::ColumnBinding,_true>::operator[](&local_e0,sVar10);
        __args_1 = vector<duckdb::ColumnBinding,_true>::operator[](&local_50,sVar10);
        __args_2 = vector<duckdb::LogicalType,_true>::operator[](&pLVar5->types,sVar10);
        ::std::vector<duckdb::ReplacementBinding,std::allocator<duckdb::ReplacementBinding>>::
        emplace_back<duckdb::ColumnBinding_const&,duckdb::ColumnBinding_const&,duckdb::LogicalType_const&>
                  ((vector<duckdb::ReplacementBinding,std::allocator<duckdb::ReplacementBinding>> *)
                   (local_c8 + 8),pvVar6,__args_1,__args_2);
        pvVar9 = vector<duckdb::optional_ptr<duckdb::BaseStatistics,_true>,_true>::operator[]
                           (&local_98,sVar10);
        if (pvVar9->ptr != (BaseStatistics *)0x0) {
          pvVar9 = vector<duckdb::optional_ptr<duckdb::BaseStatistics,_true>,_true>::operator[]
                             (&local_98,sVar10);
          optional_ptr<duckdb::BaseStatistics,_true>::CheckValid(pvVar9);
          BaseStatistics::ToUnique((BaseStatistics *)&local_e8);
          this_03 = (__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                     *)::std::__detail::
                       _Map_base<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)((local_f0.ptr)->children).
                                       super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                                       .
                                       super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish,__args_1);
          pBVar3 = local_e8;
          local_e8 = (BaseStatistics *)0x0;
          ::std::
          __uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>::
          reset(this_03,pBVar3);
          pBVar3 = local_e8;
          if (local_e8 != (BaseStatistics *)0x0) {
            BaseStatistics::~BaseStatistics(local_e8);
            operator_delete(pBVar3);
          }
        }
        sVar10 = sVar10 + 1;
      } while (sVar10 < (ulong)((long)local_e0.
                                      super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                                      .
                                      super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_e0.
                                      super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                                      .
                                      super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 4));
    }
    aStack_c0._24_8_ =
         (op->
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    optional_ptr<duckdb::LogicalOperator,_true>::CheckValid
              ((optional_ptr<duckdb::LogicalOperator,_true> *)this_00);
    ColumnBindingReplacer::VisitOperator
              ((ColumnBindingReplacer *)local_c8,
               (LogicalOperator *)
               (this_00->
               super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
               ).
               super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    local_c8 = (undefined1  [8])&PTR__ColumnBindingReplacer_0247eb48;
    ::std::vector<duckdb::ReplacementBinding,_std::allocator<duckdb::ReplacementBinding>_>::~vector
              ((vector<duckdb::ReplacementBinding,_std::allocator<duckdb::ReplacementBinding>_> *)
               (local_c8 + 8));
    if ((BaseStatistics *)
        local_50.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
        super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
        super__Vector_impl_data._M_start != (BaseStatistics *)0x0) {
      operator_delete(local_50.
                      super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
                      super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if ((LogicalProjection *)local_100._0_8_ != (LogicalProjection *)0x0) {
    (*(code *)(((ClientContext *)((LogicalOperator *)local_100._0_8_)->_vptr_LogicalOperator)->
              super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
              super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
              ();
  }
  if ((BaseStatistics *)
      local_98.
      super_vector<duckdb::optional_ptr<duckdb::BaseStatistics,_true>,_std::allocator<duckdb::optional_ptr<duckdb::BaseStatistics,_true>_>_>
      .
      super__Vector_base<duckdb::optional_ptr<duckdb::BaseStatistics,_true>,_std::allocator<duckdb::optional_ptr<duckdb::BaseStatistics,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (BaseStatistics *)0x0) {
    operator_delete(local_98.
                    super_vector<duckdb::optional_ptr<duckdb::BaseStatistics,_true>,_std::allocator<duckdb::optional_ptr<duckdb::BaseStatistics,_true>_>_>
                    .
                    super__Vector_base<duckdb::optional_ptr<duckdb::BaseStatistics,_true>,_std::allocator<duckdb::optional_ptr<duckdb::BaseStatistics,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::~vector(&local_78);
  if ((element_type *)
      local_e0.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
      super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
      super__Vector_impl_data._M_start != (element_type *)0x0) {
    operator_delete(local_e0.
                    super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
                    super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void CompressedMaterialization::CreateDecompressProjection(unique_ptr<LogicalOperator> &op,
                                                           CompressedMaterializationInfo &info) {
	const auto bindings = op->GetColumnBindings();
	op->ResolveOperatorTypes();
	const auto &types = op->types;

	// Create decompress expressions for everything we compressed
	auto &binding_map = info.binding_map;
	vector<unique_ptr<Expression>> decompress_exprs;
	vector<optional_ptr<BaseStatistics>> statistics;
	for (idx_t col_idx = 0; col_idx < bindings.size(); col_idx++) {
		const auto &binding = bindings[col_idx];
		auto decompress_expr = make_uniq_base<Expression, BoundColumnRefExpression>(types[col_idx], binding);
		optional_ptr<BaseStatistics> stats;
		for (auto &entry : binding_map) {
			auto &binding_info = entry.second;
			if (binding_info.binding != binding) {
				continue;
			}
			stats = binding_info.stats.get();
			if (binding_info.needs_decompression) {
				decompress_expr = GetDecompressExpression(std::move(decompress_expr), binding_info.type, *stats);
			}
		}
		statistics.push_back(stats);
		decompress_exprs.emplace_back(std::move(decompress_expr));
	}

	// Replace op with a projection
	const auto table_index = optimizer.binder.GenerateTableIndex();
	auto decompress_projection = make_uniq<LogicalProjection>(table_index, std::move(decompress_exprs));
	if (op->has_estimated_cardinality) {
		decompress_projection->SetEstimatedCardinality(op->estimated_cardinality);
	}

	decompress_projection->children.emplace_back(std::move(op));
	op = std::move(decompress_projection);

	// Check if we're placing a projection on top of the root
	if (RefersToSameObject(*op->children[0], *root)) {
		root = op;
		return;
	}

	// Get the new bindings and types
	auto new_bindings = op->GetColumnBindings();
	op->ResolveOperatorTypes();
	auto &new_types = op->types;

	// Initialize a ColumnBindingReplacer with the new bindings and types
	ColumnBindingReplacer replacer;
	auto &replacement_bindings = replacer.replacement_bindings;
	for (idx_t col_idx = 0; col_idx < bindings.size(); col_idx++) {
		const auto &old_binding = bindings[col_idx];
		const auto &new_binding = new_bindings[col_idx];
		const auto &new_type = new_types[col_idx];
		replacement_bindings.emplace_back(old_binding, new_binding, new_type);

		if (statistics[col_idx]) {
			statistics_map[new_binding] = statistics[col_idx]->ToUnique();
		}
	}

	// Make sure we skip the decompress operator when replacing bindings
	replacer.stop_operator = op.get();

	// Make the plan consistent again
	replacer.VisitOperator(*root);
}